

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O1

void build_terminal_node_mappings_single_tree<IsoTree>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *mappings,size_t *n_terminal,
               vector<IsoTree,_std::allocator<IsoTree>_> *tree)

{
  pointer __s;
  pointer puVar1;
  pointer pIVar2;
  size_t *psVar3;
  long lVar4;
  long lVar5;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (mappings,((long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  if ((mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(mappings);
  }
  __s = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar1) {
    memset(__s,0,((long)puVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  *n_terminal = 0;
  pIVar2 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pIVar2;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 4) * 0x6db6db6db6db6db7;
    psVar3 = &pIVar2->tree_left;
    lVar5 = 0;
    do {
      if (*psVar3 == 0) {
        __s[lVar5] = *n_terminal;
        *n_terminal = *n_terminal + 1;
      }
      lVar5 = lVar5 + 1;
      psVar3 = psVar3 + 0xe;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return;
}

Assistant:

void build_terminal_node_mappings_single_tree(std::vector<size_t> &mappings, size_t &n_terminal, const std::vector<Tree> &tree)
{
    mappings.resize(tree.size());
    mappings.shrink_to_fit();
    std::fill(mappings.begin(), mappings.end(), (size_t)0);
    
    n_terminal = 0;
    for (size_t node = 0; node < tree.size(); node++)
    {
        if (is_terminal_node(tree[node]))
        {
            mappings[node] = n_terminal;
            n_terminal++;
        }
    }
}